

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTrajectory::ArchiveIN(ChLinkTrajectory *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_60;
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkTrajectory>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_30._value = &this->space_fx;
  local_30._name = "space_fx";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->trajectory_line;
  local_48._name = "trajectory_line";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->modulo_s;
  local_60._name = "modulo_s";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChLinkTrajectory::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkTrajectory>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(space_fx);
    marchive >> CHNVP(trajectory_line);
    marchive >> CHNVP(modulo_s);
}